

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int tinyexr::DecodeEXRImage
              (EXRImage *exr_image,EXRHeader *exr_header,uchar *head,uchar *marker,char **err)

{
  reference pvVar1;
  value_type *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  undefined8 *in_R8;
  unsigned_long_long offset;
  size_t y;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> offsets;
  size_t num_y_tiles;
  size_t num_x_tiles;
  size_t num_blocks;
  int data_height;
  int data_width;
  int num_scanline_blocks;
  uchar *in_stack_000000e8;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *in_stack_000000f0;
  EXRHeader *in_stack_000000f8;
  EXRImage *in_stack_00000100;
  allocator_type *__a;
  size_type in_stack_ffffffffffffff68;
  value_type vVar2;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *in_stack_ffffffffffffff70;
  ulong __n;
  allocator_type local_71;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> local_70;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  int local_3c;
  int local_38;
  int local_34;
  value_type *local_28;
  int local_4;
  
  if ((((in_RDI == 0) || (in_RSI == 0)) || (in_RDX == 0)) || (in_RCX == (value_type *)0x0)) {
    if (in_R8 != (undefined8 *)0x0) {
      *in_R8 = "Invalid argument.";
    }
    local_4 = -3;
  }
  else {
    local_34 = 1;
    if (*(int *)(in_RSI + 0x10888) == 3) {
      local_34 = 0x10;
    }
    else if (*(int *)(in_RSI + 0x10888) == 4) {
      local_34 = 0x20;
    }
    else if (*(int *)(in_RSI + 0x10888) == 0x80) {
      local_34 = 0x10;
    }
    local_38 = (*(int *)(in_RSI + 0x10) - *(int *)(in_RSI + 8)) + 1;
    local_3c = (*(int *)(in_RSI + 0x14) - *(int *)(in_RSI + 0xc)) + 1;
    if (*(int *)(in_RSI + 0x34) < 1) {
      if (*(int *)(in_RSI + 0x38) == 0) {
        local_48 = (ulong)(long)local_3c / (ulong)(long)local_34;
        if (local_48 * (long)local_34 < (ulong)(long)local_3c) {
          local_48 = local_48 + 1;
        }
      }
      else {
        local_50 = (ulong)(long)local_38 / (ulong)(long)*(int *)(in_RSI + 0x3c);
        if (local_50 * (long)*(int *)(in_RSI + 0x3c) < (ulong)(long)local_38) {
          local_50 = local_50 + 1;
        }
        local_58 = (ulong)(long)local_3c / (ulong)(long)*(int *)(in_RSI + 0x40);
        if (local_58 * (long)*(int *)(in_RSI + 0x40) < (ulong)(long)local_3c) {
          local_58 = local_58 + 1;
        }
        local_48 = local_50 * local_58;
      }
    }
    else {
      local_48 = (ulong)*(int *)(in_RSI + 0x34);
    }
    __a = &local_71;
    local_28 = in_RCX;
    std::allocator<unsigned_long_long>::allocator((allocator<unsigned_long_long> *)0x15b42a);
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,__a);
    std::allocator<unsigned_long_long>::~allocator((allocator<unsigned_long_long> *)0x15b44a);
    for (__n = 0; __n < local_48; __n = __n + 1) {
      vVar2 = *local_28;
      swap8((unsigned_long_long *)&stack0xffffffffffffff68);
      local_28 = local_28 + 1;
      pvVar1 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                         (&local_70,__n);
      *pvVar1 = vVar2;
    }
    local_4 = DecodeChunk(in_stack_00000100,in_stack_000000f8,in_stack_000000f0,in_stack_000000e8);
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~vector
              ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)__a);
  }
  return local_4;
}

Assistant:

static int DecodeEXRImage(EXRImage *exr_image, const EXRHeader *exr_header,
                          const unsigned char *head,
                          const unsigned char *marker, const char **err) {
  if (exr_image == NULL || exr_header == NULL || head == NULL ||
      marker == NULL) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  int num_scanline_blocks = 1;
  if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZIP) {
    num_scanline_blocks = 16;
  } else if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {
    num_scanline_blocks = 32;
  } else if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
    num_scanline_blocks = 16;
  }

  int data_width = exr_header->data_window[2] - exr_header->data_window[0] + 1;
  int data_height = exr_header->data_window[3] - exr_header->data_window[1] + 1;

  // Read offset tables.
  size_t num_blocks;

  if (exr_header->chunk_count > 0) {
    // Use `chunkCount` attribute.
    num_blocks = exr_header->chunk_count;
  } else if (exr_header->tiled) {
    // @todo { LoD }
    size_t num_x_tiles = static_cast<size_t>(data_width) /
                         static_cast<size_t>(exr_header->tile_size_x);
    if (num_x_tiles * static_cast<size_t>(exr_header->tile_size_x) <
        static_cast<size_t>(data_width)) {
      num_x_tiles++;
    }
    size_t num_y_tiles = static_cast<size_t>(data_height) /
                         static_cast<size_t>(exr_header->tile_size_y);
    if (num_y_tiles * static_cast<size_t>(exr_header->tile_size_y) <
        static_cast<size_t>(data_height)) {
      num_y_tiles++;
    }

    num_blocks = num_x_tiles * num_y_tiles;
  } else {
    num_blocks = static_cast<size_t>(data_height) /
                 static_cast<size_t>(num_scanline_blocks);
    if (num_blocks * static_cast<size_t>(num_scanline_blocks) <
        static_cast<size_t>(data_height)) {
      num_blocks++;
    }
  }

  std::vector<unsigned long long> offsets(num_blocks);

  for (size_t y = 0; y < num_blocks; y++) {
    unsigned long long offset;
    memcpy(&offset, marker, sizeof(unsigned long long));
    tinyexr::swap8(&offset);
    marker += sizeof(unsigned long long);  // = 8
    offsets[y] = offset;
  }

  return DecodeChunk(exr_image, exr_header, offsets, head);
}